

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSpeedup.c
# Opt level: O3

Gia_Man_t * Gia_ManSpeedup(Gia_Man_t *p,int Percentage,int Degree,int fVerbose,int fVeryVerbose)

{
  int iVar1;
  float *pfVar2;
  uint uVar3;
  uint uVar4;
  Tim_Man_t *pTVar5;
  void *pvVar6;
  Gia_Man_t *p_00;
  int *piVar7;
  Gia_Rpr_t *pGVar8;
  Vec_Int_t *vTimes;
  Vec_Int_t *vLeaves;
  Vec_Int_t *pVVar9;
  Gia_Man_t *pGVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  char *pcVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  Vec_Flt_t *pVVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  int iVar24;
  long lVar25;
  ulong uVar26;
  size_t sVar27;
  long lVar28;
  Tim_Man_t *p_01;
  long lVar29;
  float fVar30;
  double dVar31;
  float tDelta;
  uint local_84;
  ulong local_80;
  int local_6c;
  
  if (p->vMapping == (Vec_Int_t *)0x0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSpeedup.c"
                  ,0x27f,"Gia_Man_t *Gia_ManSpeedup(Gia_Man_t *, int, int, int, int)");
  }
  pvVar6 = p->pLutLib;
  if ((pvVar6 == (void *)0x0) && (p_01 = (Tim_Man_t *)p->pManTime, p_01 != (Tim_Man_t *)0x0)) {
    pTVar5 = Tim_ManDup(p_01,1);
    p->pManTime = pTVar5;
  }
  else {
    p_01 = (Tim_Man_t *)0x0;
  }
  fVar30 = Gia_ManDelayTraceLut(p);
  if (pvVar6 == (void *)0x0) {
    tDelta = 1.0;
  }
  else {
    tDelta = ((float)Percentage * fVar30) / 100.0;
  }
  if (fVerbose != 0) {
    printf("Max delay = %.2f. Delta = %.2f. ",(double)fVar30,(double)tDelta);
    pcVar15 = "LUT library";
    if (pvVar6 == (void *)0x0) {
      pcVar15 = "unit-delay";
    }
    printf("Using %s model. ",pcVar15);
    if (pvVar6 != (void *)0x0) {
      printf("Percentage = %d. ",Percentage);
    }
    putchar(10);
  }
  uVar4 = p->nObjs;
  sVar27 = (size_t)(int)uVar4;
  pvVar6 = calloc(sVar27,4);
  if (1 < (long)sVar27) {
    lVar29 = 1;
    lVar25 = 5;
    do {
      if (p->vMapping->nSize <= lVar29) goto LAB_0022c6d1;
      if (p->vMapping->pArray[lVar29] != 0) {
        if (p->vTiming->nSize <= (int)lVar25) goto LAB_0022c70f;
        if (p->vTiming->pArray[lVar25] < tDelta) {
          uVar4 = Gia_LutDelayTraceTCEdges(p,(int)lVar29,tDelta);
          *(uint *)((long)pvVar6 + lVar29 * 4) = uVar4;
          sVar27 = (size_t)(uint)p->nObjs;
        }
      }
      lVar29 = lVar29 + 1;
      uVar4 = (uint)sVar27;
      lVar25 = lVar25 + 3;
    } while (lVar29 < (int)uVar4);
  }
  if (fVerbose != 0) {
    uVar13 = 0;
    iVar24 = 0;
    if (1 < (int)uVar4) {
      uVar11 = p->vMapping->nSize;
      uVar16 = 1;
      if (1 < (int)uVar11) {
        uVar16 = (ulong)uVar11;
      }
      uVar22 = 1;
      iVar24 = 0;
      uVar13 = 0;
      do {
        if (uVar22 == uVar16) goto LAB_0022c6d1;
        piVar7 = p->vMapping->pArray;
        uVar23 = piVar7[uVar22];
        uVar12 = (ulong)uVar23;
        if (uVar12 != 0) {
          if (((int)uVar23 < 0) || (uVar11 <= uVar23)) goto LAB_0022c6d1;
          uVar23 = piVar7[uVar12];
          uVar3 = uVar23;
          if ((int)uVar23 < 1) {
            uVar3 = 0;
          }
          if (0 < (int)uVar23) {
            uVar26 = 0;
            do {
              uVar23 = piVar7[uVar12 + uVar26 + 1];
              if (uVar4 <= uVar23) goto LAB_0022c6f0;
              if (((undefined1  [12])p->pObjs[uVar23] & (undefined1  [12])0x9fffffff) !=
                  (undefined1  [12])0x9fffffff) {
                uVar21 = (ulong)uVar23 * 3 + 2;
                if (p->vTiming->nSize <= (int)uVar21) goto LAB_0022c70f;
                pfVar2 = p->vTiming->pArray + (uVar21 & 0xffffffff);
                if (*pfVar2 <= tDelta && tDelta != *pfVar2) {
                  uVar13 = uVar13 + 1;
                }
              }
              uVar26 = uVar26 + 1;
            } while (uVar3 != uVar26);
          }
          uVar23 = *(uint *)((long)pvVar6 + uVar22 * 4);
          uVar23 = (uVar23 >> 1 & 0x55555555) + (uVar23 & 0x55555555);
          uVar23 = (uVar23 >> 2 & 0x33333333) + (uVar23 & 0x33333333);
          uVar23 = (uVar23 >> 4 & 0x7070707) + (uVar23 & 0x7070707);
          uVar23 = (uVar23 >> 8 & 0xf000f) + (uVar23 & 0xf000f);
          iVar24 = (uVar23 >> 0x10) + iVar24 + (uVar23 & 0xffff);
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 != uVar4);
    }
    uVar4 = Gia_ManLutFaninCount(p);
    dVar31 = 0.0;
    if (uVar13 != 0) {
      dVar31 = (double)iVar24 / (double)(int)uVar13;
    }
    printf("Edges: Total = %7d. 0-slack = %7d. Critical = %7d. Ratio = %4.2f\n",dVar31,(ulong)uVar4,
           (ulong)uVar13);
  }
  p_00 = Gia_ManDup(p);
  Gia_ManHashStart(p_00);
  iVar24 = p_00->nObjs;
  sVar27 = (long)iVar24 * 3 + 1000;
  piVar7 = (int *)calloc(sVar27,4);
  p_00->pNexts = piVar7;
  pGVar8 = (Gia_Rpr_t *)calloc(sVar27,4);
  p_00->pReprs = pGVar8;
  if (-0x14e < (long)iVar24) {
    uVar16 = 0;
    do {
      p_00->pReprs[uVar16] = (Gia_Rpr_t)((uint)p_00->pReprs[uVar16] | 0xfffffff);
      uVar16 = uVar16 + 1;
    } while ((sVar27 & 0xffffffff) != uVar16);
  }
  vTimes = (Vec_Int_t *)malloc(0x10);
  vTimes->nCap = 0x10;
  piVar7 = (int *)malloc(0x40);
  vTimes->pArray = piVar7;
  vLeaves = (Vec_Int_t *)malloc(0x10);
  vLeaves->nCap = 0x10;
  vLeaves->nSize = 0;
  piVar7 = (int *)malloc(0x40);
  vLeaves->pArray = piVar7;
  uVar16 = (ulong)(uint)p->nObjs;
  local_84 = 0;
  local_6c = 0;
  if (1 < p->nObjs) {
    uVar22 = 1;
    local_6c = 0;
    local_84 = 0;
    do {
      pVVar9 = p->vMapping;
      uVar12 = (ulong)pVVar9->nSize;
      if ((long)uVar12 <= (long)uVar22) {
LAB_0022c6d1:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar7 = pVVar9->pArray;
      uVar4 = piVar7[uVar22];
      uVar26 = (ulong)uVar4;
      if (uVar26 != 0) {
        if (p->vTiming->nSize <= (int)uVar22 * 3 + 2) goto LAB_0022c70f;
        if (p->vTiming->pArray[uVar22 * 3 + 2] < tDelta) {
          if (((int)uVar4 < 0) || ((uint)pVVar9->nSize <= uVar4)) goto LAB_0022c6d1;
          local_80 = 0;
          if (0 < piVar7[uVar26]) {
            local_80 = 0;
            uVar21 = 0;
            do {
              iVar18 = piVar7[uVar26 + uVar21 + 1];
              if (((long)iVar18 < 0) || ((int)uVar16 <= iVar18)) goto LAB_0022c6f0;
              if (((undefined1  [12])p->pObjs[iVar18] & (undefined1  [12])0x9fffffff) !=
                  (undefined1  [12])0x9fffffff) {
                local_80 = (ulong)((int)local_80 +
                                  (uint)((*(uint *)((long)pvVar6 + uVar22 * 4) >>
                                          ((uint)uVar21 & 0x1f) & 1) != 0));
              }
              uVar21 = uVar21 + 1;
            } while ((uint)piVar7[uVar26] != uVar21);
          }
          if (fVeryVerbose != 0 || (int)local_80 != 0) {
            local_84 = local_84 + 1;
            vTimes->nSize = 0;
            if ((int)local_80 != 0) {
              lVar25 = 0;
              while( true ) {
                piVar7 = pVVar9->pArray;
                lVar29 = (long)piVar7[uVar22];
                if ((lVar29 < 0) || (uVar4 = (uint)uVar12, uVar4 <= (uint)piVar7[uVar22]))
                goto LAB_0022c6d1;
                if (piVar7[lVar29] <= lVar25) break;
                iVar18 = piVar7[lVar29 + lVar25 + 1];
                lVar29 = (long)iVar18;
                if ((lVar29 < 0) || (p->nObjs <= iVar18)) goto LAB_0022c6f0;
                if ((((undefined1  [12])p->pObjs[lVar29] & (undefined1  [12])0x9fffffff) !=
                     (undefined1  [12])0x9fffffff) &&
                   ((*(uint *)((long)pvVar6 + uVar22 * 4) >> ((uint)lVar25 & 0x1f) & 1) != 0)) {
                  if ((int)uVar4 <= iVar18) goto LAB_0022c6d1;
                  lVar28 = 0;
                  while( true ) {
                    piVar7 = pVVar9->pArray;
                    lVar17 = (long)piVar7[lVar29];
                    if ((lVar17 < 0) || ((uint)uVar12 <= (uint)piVar7[lVar29])) goto LAB_0022c6d1;
                    if (piVar7[lVar17] <= lVar28) break;
                    if ((*(uint *)((long)pvVar6 + lVar29 * 4) >> ((uint)lVar28 & 0x1f) & 1) != 0) {
                      if (0 < (long)vTimes->nSize) {
                        lVar19 = 0;
                        do {
                          if (vTimes->pArray[lVar19] == piVar7[lVar17 + lVar28 + 1])
                          goto LAB_0022c1cb;
                          lVar19 = lVar19 + 1;
                        } while (vTimes->nSize != lVar19);
                      }
                      Vec_IntPush(vTimes,piVar7[lVar17 + lVar28 + 1]);
                      pVVar9 = p->vMapping;
                    }
LAB_0022c1cb:
                    lVar28 = lVar28 + 1;
                    uVar12 = (ulong)(uint)pVVar9->nSize;
                    if (pVVar9->nSize <= iVar18) goto LAB_0022c6d1;
                  }
                }
                lVar25 = lVar25 + 1;
                uVar12 = (ulong)pVVar9->nSize;
                if ((long)uVar12 <= (long)uVar22) goto LAB_0022c6d1;
              }
              uVar13 = vTimes->nSize;
              if ((int)uVar13 <= Degree && uVar13 != 0) {
                vLeaves->nSize = 0;
                if ((long)(int)uVar4 <= (long)uVar22) goto LAB_0022c6d1;
                local_6c = local_6c + 1;
                lVar25 = 0;
                while( true ) {
                  piVar7 = pVVar9->pArray;
                  lVar29 = (long)piVar7[uVar22];
                  if ((lVar29 < 0) || ((uint)uVar12 <= (uint)piVar7[uVar22])) goto LAB_0022c6d1;
                  if (piVar7[lVar29] <= lVar25) break;
                  iVar18 = piVar7[lVar29 + lVar25 + 1];
                  lVar29 = (long)iVar18;
                  if ((lVar29 < 0) || (p->nObjs <= iVar18)) goto LAB_0022c6f0;
                  if (((undefined1  [12])p->pObjs[lVar29] & (undefined1  [12])0x9fffffff) ==
                      (undefined1  [12])0x9fffffff) {
                    if (0 < (long)vLeaves->nSize) {
                      lVar29 = 0;
                      do {
                        if (vLeaves->pArray[lVar29] == iVar18) goto LAB_0022c33c;
                        lVar29 = lVar29 + 1;
                      } while (vLeaves->nSize != lVar29);
                    }
                    Vec_IntPush(vLeaves,iVar18);
                    pVVar9 = p->vMapping;
                  }
                  else {
                    if ((int)(uint)uVar12 <= iVar18) goto LAB_0022c6d1;
                    lVar28 = 0;
                    while( true ) {
                      piVar7 = pVVar9->pArray;
                      lVar17 = (long)piVar7[lVar29];
                      if ((lVar17 < 0) || ((uint)uVar12 <= (uint)piVar7[lVar29])) goto LAB_0022c6d1;
                      if (piVar7[lVar17] <= lVar28) break;
                      if (0 < (long)vLeaves->nSize) {
                        lVar19 = 0;
                        do {
                          if (vLeaves->pArray[lVar19] == piVar7[lVar17 + lVar28 + 1])
                          goto LAB_0022c326;
                          lVar19 = lVar19 + 1;
                        } while (vLeaves->nSize != lVar19);
                      }
                      Vec_IntPush(vLeaves,piVar7[lVar17 + lVar28 + 1]);
                      pVVar9 = p->vMapping;
LAB_0022c326:
                      lVar28 = lVar28 + 1;
                      uVar12 = (ulong)(uint)pVVar9->nSize;
                      if (pVVar9->nSize <= iVar18) goto LAB_0022c6d1;
                    }
                  }
LAB_0022c33c:
                  lVar25 = lVar25 + 1;
                  uVar12 = (ulong)pVVar9->nSize;
                  if ((long)uVar12 <= (long)uVar22) goto LAB_0022c6d1;
                }
                if (fVeryVerbose != 0) {
                  printf("%5d Node %5d : %d %2d %2d  ",(ulong)local_84,uVar22 & 0xffffffff,local_80,
                         (ulong)uVar13,(ulong)(uint)vLeaves->nSize);
                  pVVar9 = p->vMapping;
                  lVar25 = (long)pVVar9->nSize;
                  if (lVar25 <= (long)uVar22) goto LAB_0022c6d1;
                  lVar29 = 0;
                  while( true ) {
                    piVar7 = pVVar9->pArray;
                    lVar28 = (long)piVar7[uVar22];
                    if ((lVar28 < 0) || ((uint)lVar25 <= (uint)piVar7[uVar22])) goto LAB_0022c6d1;
                    if (piVar7[lVar28] <= lVar29) break;
                    uVar4 = piVar7[lVar28 + lVar29 + 1];
                    if ((int)uVar4 < 0) goto LAB_0022c70f;
                    uVar11 = uVar4 * 3 + 2;
                    if (p->vTiming->nSize <= (int)uVar11) goto LAB_0022c70f;
                    pcVar15 = "*";
                    if ((*(uint *)((long)pvVar6 + uVar22 * 4) >> ((uint)lVar29 & 0x1f) & 1) == 0) {
                      pcVar15 = "";
                    }
                    printf("%d(%.2f)%s ",(double)p->vTiming->pArray[uVar11],(ulong)uVar4,pcVar15);
                    lVar29 = lVar29 + 1;
                    pVVar9 = p->vMapping;
                    lVar25 = (long)pVVar9->nSize;
                    if (lVar25 <= (long)uVar22) goto LAB_0022c6d1;
                  }
                  putchar(10);
                }
                if (1 < (int)uVar13) {
                  piVar7 = vTimes->pArray;
                  iVar18 = *piVar7;
                  if (iVar18 < 0) {
LAB_0022c70f:
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecFlt.h"
                                  ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
                  }
                  pVVar20 = p->vTiming;
                  uVar4 = iVar18 * 3 + 2;
                  if (((pVVar20->nSize <= (int)uVar4) || (iVar1 = piVar7[1], iVar1 < 0)) ||
                     (uVar11 = iVar1 * 3 + 2, pVVar20->nSize <= (int)uVar11)) goto LAB_0022c70f;
                  pfVar2 = pVVar20->pArray;
                  iVar14 = iVar1;
                  if (pfVar2[uVar4] <= pfVar2[uVar11] && pfVar2[uVar11] != pfVar2[uVar4]) {
                    *piVar7 = iVar1;
                    piVar7[1] = iVar18;
                    iVar14 = iVar18;
                    iVar18 = iVar1;
                  }
                  if (uVar13 != 2) {
                    uVar4 = iVar14 * 3 + 2;
                    if (((pVVar20->nSize <= (int)uVar4) || (iVar1 = piVar7[2], iVar1 < 0)) ||
                       (uVar13 = iVar1 * 3 + 2, pVVar20->nSize <= (int)uVar13)) goto LAB_0022c70f;
                    if (pfVar2[uVar4] <= pfVar2[uVar13] && pfVar2[uVar13] != pfVar2[uVar4]) {
                      piVar7[1] = iVar1;
                      piVar7[2] = iVar14;
                      iVar14 = iVar1;
                    }
                    uVar4 = iVar18 * 3 + 2;
                    if ((pVVar20->nSize <= (int)uVar4) ||
                       (uVar13 = iVar14 * 3 + 2, (uint)pVVar20->nSize <= uVar13)) goto LAB_0022c70f;
                    if (pfVar2[uVar4] <= pfVar2[uVar13] && pfVar2[uVar13] != pfVar2[uVar4]) {
                      *piVar7 = iVar14;
                      piVar7[1] = iVar18;
                    }
                  }
                }
                if ((long)p->nObjs <= (long)uVar22) {
LAB_0022c6f0:
                  __assert_fail("v >= 0 && v < p->nObjs",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
                }
                Gia_ManSpeedupObj(p_00,p,p->pObjs + uVar22,vLeaves,vTimes);
                if (iVar24 * 3 + 900 < p_00->nObjs) {
                  puts("Speedup stopped adding choices because there was too many to add.");
                  break;
                }
              }
            }
          }
        }
      }
      uVar22 = uVar22 + 1;
      uVar16 = (ulong)p->nObjs;
    } while ((long)uVar22 < (long)uVar16);
  }
  pVVar20 = p->vTiming;
  if (pVVar20 == (Vec_Flt_t *)0x0) {
    __assert_fail("p->vTiming != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x26d,"void Gia_ManTimeStop(Gia_Man_t *)");
  }
  if (pVVar20->pArray != (float *)0x0) {
    free(pVVar20->pArray);
    p->vTiming->pArray = (float *)0x0;
    pVVar20 = p->vTiming;
    if (pVVar20 == (Vec_Flt_t *)0x0) goto LAB_0022c5fc;
  }
  free(pVVar20);
  p->vTiming = (Vec_Flt_t *)0x0;
LAB_0022c5fc:
  if (vTimes->pArray != (int *)0x0) {
    free(vTimes->pArray);
  }
  free(vTimes);
  if (vLeaves->pArray != (int *)0x0) {
    free(vLeaves->pArray);
  }
  free(vLeaves);
  if (pvVar6 != (void *)0x0) {
    free(pvVar6);
  }
  if (fVerbose != 0) {
    uVar4 = Gia_ManLutNum(p);
    dVar31 = 0.0;
    if (local_84 != 0) {
      dVar31 = (double)local_6c / (double)(int)local_84;
    }
    printf("Nodes: Total = %7d. 0-slack = %7d. Workable = %7d. Ratio = %4.2f\n",dVar31,(ulong)uVar4)
    ;
  }
  if (p_01 != (Tim_Man_t *)0x0) {
    Tim_ManStop((Tim_Man_t *)p->pManTime);
    p->pManTime = p_01;
  }
  pGVar10 = Gia_ManEquivToChoices(p_00,1);
  Gia_ManStop(p_00);
  return pGVar10;
}

Assistant:

Gia_Man_t * Gia_ManSpeedup( Gia_Man_t * p, int Percentage, int Degree, int fVerbose, int fVeryVerbose )
{
    Gia_Man_t * pNew, * pTemp;
    Vec_Int_t * vTimeCries, * vTimeFanins;
    int iObj, iFanin, iFanin2, nNodesNew;
    float tDelta, tArrival;
    int i, k, k2, Counter, CounterRes, nTimeCris;
    int fUseLutLib = (p->pLutLib != NULL);
    void * pTempTim = NULL;
    unsigned * puTCEdges;
    assert( Gia_ManHasMapping(p) );
    if ( !fUseLutLib && p->pManTime )
    {
        pTempTim = p->pManTime;
        p->pManTime = Tim_ManDup( (Tim_Man_t *)pTempTim, 1 );
    }
    // perform delay trace
    tArrival = Gia_ManDelayTraceLut( p );
    tDelta = fUseLutLib ? tArrival*Percentage/100.0 : 1.0;
    if ( fVerbose )
    {
        printf( "Max delay = %.2f. Delta = %.2f. ", tArrival, tDelta );
        printf( "Using %s model. ", fUseLutLib ? "LUT library" : "unit-delay" );
        if ( fUseLutLib )
            printf( "Percentage = %d. ", Percentage );
        printf( "\n" );
    }
    // mark the timing critical nodes and edges
    puTCEdges = ABC_CALLOC( unsigned, Gia_ManObjNum(p) );
    Gia_ManForEachLut( p, iObj )
    {
        if ( Gia_ObjTimeSlack(p, iObj) >= tDelta )
            continue;
        puTCEdges[iObj] = Gia_LutDelayTraceTCEdges( p, iObj, tDelta );
    }
    if ( fVerbose )
    {
        Counter = CounterRes = 0;
        Gia_ManForEachLut( p, iObj )
        {
            Gia_LutForEachFanin( p, iObj, iFanin, k )
                if ( !Gia_ObjIsCi(Gia_ManObj(p, iFanin)) && Gia_ObjTimeSlack(p, iFanin) < tDelta )
                    Counter++;
            CounterRes += Gia_WordCountOnes( puTCEdges[iObj] );
        }
        printf( "Edges: Total = %7d. 0-slack = %7d. Critical = %7d. Ratio = %4.2f\n", 
            Gia_ManLutFaninCount(p), Counter, CounterRes, Counter? 1.0*CounterRes/Counter : 0.0 );
    }

    // start the resulting network
    pNew = Gia_ManDup( p );
    Gia_ManHashStart( pNew );
    nNodesNew = 1000 + 3 * Gia_ManObjNum(pNew);
    pNew->pNexts = ABC_CALLOC( int, nNodesNew );
    pNew->pReprs = ABC_CALLOC( Gia_Rpr_t, nNodesNew );
    for ( i = 0; i < nNodesNew; i++ )
        Gia_ObjSetRepr( pNew, i, GIA_VOID );

    // collect nodes to be used for resynthesis
    Counter = CounterRes = 0;
    vTimeCries = Vec_IntAlloc( 16 );
    vTimeFanins = Vec_IntAlloc( 16 );
    Gia_ManForEachLut( p, iObj )
    {
        if ( Gia_ObjTimeSlack(p, iObj) >= tDelta )
            continue;
        // count the number of non-PI timing-critical nodes
        nTimeCris = 0;
        Gia_LutForEachFanin( p, iObj, iFanin, k )
            if ( !Gia_ObjIsCi(Gia_ManObj(p, iFanin)) && (puTCEdges[iObj] & (1<<k)) )
                nTimeCris++;
        if ( !fVeryVerbose && nTimeCris == 0 )
            continue;
        Counter++;
        // count the total number of timing critical second-generation nodes
        Vec_IntClear( vTimeCries );
        if ( nTimeCris )
        {
            Gia_LutForEachFanin( p, iObj, iFanin, k )
                if ( !Gia_ObjIsCi(Gia_ManObj(p, iFanin)) && (puTCEdges[iObj] & (1<<k)) )
                    Gia_LutForEachFanin( p, iFanin, iFanin2, k2 )
                        if ( puTCEdges[iFanin] & (1<<k2) )
                            Vec_IntPushUnique( vTimeCries, iFanin2 );
        }
//        if ( !fVeryVerbose && (Vec_IntSize(vTimeCries) == 0 || Vec_IntSize(vTimeCries) > Degree) )
        if ( (Vec_IntSize(vTimeCries) == 0 || Vec_IntSize(vTimeCries) > Degree) )
            continue;
        CounterRes++;
        // collect second generation nodes
        Vec_IntClear( vTimeFanins );
        Gia_LutForEachFanin( p, iObj, iFanin, k )
        {
            if ( Gia_ObjIsCi(Gia_ManObj(p, iFanin)) )
                Vec_IntPushUnique( vTimeFanins, iFanin );
            else
                Gia_LutForEachFanin( p, iFanin, iFanin2, k2 )
                    Vec_IntPushUnique( vTimeFanins, iFanin2 );                    
        }
        // print the results
        if ( fVeryVerbose )
        {
        printf( "%5d Node %5d : %d %2d %2d  ", Counter, iObj, 
            nTimeCris, Vec_IntSize(vTimeCries), Vec_IntSize(vTimeFanins) );
        Gia_LutForEachFanin( p, iObj, iFanin, k )
            printf( "%d(%.2f)%s ", iFanin, Gia_ObjTimeSlack(p, iFanin), (puTCEdges[iObj] & (1<<k))? "*":"" );
        printf( "\n" );
        }
        // add the node to choices
        if ( Vec_IntSize(vTimeCries) == 0 || Vec_IntSize(vTimeCries) > Degree )
            continue;
        // order the fanins in the increasing order of criticalily
        if ( Vec_IntSize(vTimeCries) > 1 )
        {
            iFanin = Vec_IntEntry( vTimeCries, 0 );
            iFanin2 = Vec_IntEntry( vTimeCries, 1 );
            if ( Gia_ObjTimeSlack(p, iFanin) < Gia_ObjTimeSlack(p, iFanin2) )
            {
                Vec_IntWriteEntry( vTimeCries, 0, iFanin2 );
                Vec_IntWriteEntry( vTimeCries, 1, iFanin );
            }
        }
        if ( Vec_IntSize(vTimeCries) > 2 )
        {
            iFanin = Vec_IntEntry( vTimeCries, 1 );
            iFanin2 = Vec_IntEntry( vTimeCries, 2 );
            if ( Gia_ObjTimeSlack(p, iFanin) < Gia_ObjTimeSlack(p, iFanin2) )
            {
                Vec_IntWriteEntry( vTimeCries, 1, iFanin2 );
                Vec_IntWriteEntry( vTimeCries, 2, iFanin );
            }
            iFanin = Vec_IntEntry( vTimeCries, 0 );
            iFanin2 = Vec_IntEntry( vTimeCries, 1 );
            if ( Gia_ObjTimeSlack(p, iFanin) < Gia_ObjTimeSlack(p, iFanin2) )
            {
                Vec_IntWriteEntry( vTimeCries, 0, iFanin2 );
                Vec_IntWriteEntry( vTimeCries, 1, iFanin );
            }
        }
        // add choice
        Gia_ManSpeedupObj( pNew, p, Gia_ManObj(p,iObj), vTimeFanins, vTimeCries );
        // quit if the number of nodes is large
        if ( Gia_ManObjNum(pNew) > nNodesNew - 100 )
        {
            printf( "Speedup stopped adding choices because there was too many to add.\n" );
            break;
        }
    }
    Gia_ManTimeStop( p );
    Vec_IntFree( vTimeCries );
    Vec_IntFree( vTimeFanins );
    ABC_FREE( puTCEdges );
    if ( fVerbose )
        printf( "Nodes: Total = %7d. 0-slack = %7d. Workable = %7d. Ratio = %4.2f\n", 
        Gia_ManLutNum(p), Counter, CounterRes, Counter? 1.0*CounterRes/Counter : 0.0 ); 
    if ( pTempTim )
    {
        Tim_ManStop( (Tim_Man_t *)p->pManTime );
        p->pManTime = pTempTim;
    }
    // derive AIG with choices
//Gia_ManPrintStats( pNew, 0 );
    pTemp = Gia_ManEquivToChoices( pNew, 1 );
    Gia_ManStop( pNew );
//Gia_ManPrintStats( pTemp, 0 );
//    pNew = Gia_ManDupOrderDfsChoices( pTemp );
//    Gia_ManStop( pTemp );
//Gia_ManPrintStats( pNew, 0 );
//    return pNew;
    return pTemp;
}